

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorTemplateBase<unsigned_short,_true>::push_back
          (SmallVectorTemplateBase<unsigned_short,_true> *this,unsigned_short *Elt)

{
  uint uVar1;
  
  uVar1 = *(uint *)(this + 8);
  if (*(uint *)(this + 0xc) <= uVar1) {
    SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 0x10,0,2);
    uVar1 = *(uint *)(this + 8);
  }
  *(unsigned_short *)(*(long *)this + (ulong)uVar1 * 2) = *Elt;
  if (*(uint *)(this + 8) < *(uint *)(this + 0xc)) {
    *(uint *)(this + 8) = *(uint *)(this + 8) + 1;
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(this->end(), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }